

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O1

void __thiscall anon_func::TypeRewriter::~TypeRewriter(TypeRewriter *this)

{
  ::wasm::GlobalTypeRewriter::~GlobalTypeRewriter(&this->super_GlobalTypeRewriter);
  operator_delete(this,0x70);
  return;
}

Assistant:

void updateTypes(Module& wasm) {
    class TypeRewriter : public GlobalTypeRewriter {
      TypeRefining& parent;

    public:
      TypeRewriter(Module& wasm, TypeRefining& parent)
        : GlobalTypeRewriter(wasm), parent(parent) {}

      void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        const auto& oldFields = oldStructType.getStruct().fields;
        auto& newFields = struct_.fields;

        for (Index i = 0; i < newFields.size(); i++) {
          auto oldType = oldFields[i].type;
          if (!oldType.isRef()) {
            continue;
          }
          auto newType = parent.finalInfos[oldStructType][i].getLUB();
          newFields[i].type = getTempType(newType);
        }
      }
    };

    TypeRewriter(wasm, *this).update();

    ReFinalize().run(getPassRunner(), &wasm);
  }